

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ScalarEvolutionAnalysis::ScalarEvolutionAnalysis
          (ScalarEvolutionAnalysis *this,IRContext *context)

{
  _Rb_tree_header *p_Var1;
  SENode *pSVar2;
  pointer *__ptr;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_18;
  
  this->context_ = context;
  p_Var1 = &(this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->recurrent_node_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->node_cache_)._M_h._M_buckets = &(this->node_cache_)._M_h._M_single_bucket;
  (this->node_cache_)._M_h._M_bucket_count = 1;
  (this->node_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node_cache_)._M_h._M_element_count = 0;
  (this->node_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->node_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->pretend_equal_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pretend_equal_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       operator_new(0x30);
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       &PTR___cxa_pure_virtual_00951a38;
  *(long *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
  *(ScalarEvolutionAnalysis **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = this;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  *(int *)((long)local_18._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                 .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00951970;
  pSVar2 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                *)&local_18);
  this->cached_cant_compute_ = pSVar2;
  if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10
                ))();
  }
  return;
}

Assistant:

ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(IRContext* context)
    : context_(context), pretend_equal_{} {
  // Create and cached the CantComputeNode.
  cached_cant_compute_ =
      GetCachedOrAdd(std::unique_ptr<SECantCompute>(new SECantCompute(this)));
}